

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  char *pcVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  void *pvVar10;
  _func_void *p_Var11;
  size_t sVar12;
  char *pcVar13;
  void **__dest;
  char *pcVar14;
  byte *pbVar15;
  long lVar16;
  u64 n;
  uchar uVar17;
  uchar uVar18;
  long in_FS_OFFSET;
  void *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_40 = (void *)0x0;
  sVar8 = strlen(zFile);
  if (pzErrMsg == (char **)0x0) {
    iVar4 = 1;
    if ((db->flags & 0x10000) != 0) goto LAB_0012903f;
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x10000) == 0) {
      pcVar9 = sqlite3_mprintf("not authorized");
      *pzErrMsg = pcVar9;
      goto LAB_00129024;
    }
LAB_0012903f:
    pcVar9 = "sqlite3_extension_init";
    if (zProc != (char *)0x0) {
      pcVar9 = zProc;
    }
    if (0xffffffffffffefff < sVar8 - 0x1001) {
      pvVar10 = (*psVar3->xDlOpen)(psVar3,zFile);
      if (pvVar10 != (void *)0x0) {
LAB_0012909b:
        p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,pcVar9);
        pcVar13 = (char *)0x0;
        if (zProc == (char *)0x0 && p_Var11 == (_func_void *)0x0) {
          pcVar9 = pcVar13;
          if (zFile != (char *)0x0) {
            sVar12 = strlen(zFile);
            pcVar9 = (char *)(ulong)((uint)sVar12 & 0x3fffffff);
          }
          iVar4 = sqlite3_initialize();
          if ((iVar4 != 0) ||
             (pcVar13 = (char *)sqlite3Malloc((ulong)((int)pcVar9 + 0x1e)), pcVar13 == (char *)0x0))
          {
            (*psVar3->xDlClose)(psVar3,pvVar10);
            goto LAB_00129323;
          }
          builtin_strncpy(pcVar13,"sqlite3_",8);
          do {
            if ((long)pcVar9 < 1) {
              uVar5 = 0;
              uVar7 = uVar5;
              if (zFile == (char *)0x0) goto LAB_00129449;
              goto LAB_00129377;
            }
            pcVar14 = pcVar9 + -1;
            pcVar1 = zFile + -1 + (long)pcVar9;
            pcVar9 = pcVar14;
          } while (*pcVar1 != '/');
          uVar5 = (int)pcVar14 + 1;
LAB_00129377:
          lVar16 = 0;
          do {
            if ((ulong)(byte)zFile[lVar16 + (ulong)uVar5] == 0) {
              uVar18 = ""[(byte)"itilib"[lVar16 + 3]];
              uVar17 = '\0';
LAB_0012943a:
              uVar7 = uVar5 + 3;
              if (uVar17 != uVar18) {
                uVar7 = uVar5;
              }
              goto LAB_00129449;
            }
            uVar17 = ""[(byte)zFile[lVar16 + (ulong)uVar5]];
            uVar18 = ""[(byte)"itilib"[lVar16 + 3]];
            if (uVar17 != uVar18) goto LAB_0012943a;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          uVar7 = uVar5 + 3;
LAB_00129449:
          iVar4 = 8;
          for (pbVar15 = (byte *)(zFile + (int)uVar7);
              (bVar2 = *pbVar15, bVar2 != 0 && (bVar2 != 0x2e)); pbVar15 = pbVar15 + 1) {
            if ((""[bVar2] & 2) != 0) {
              lVar16 = (long)iVar4;
              iVar4 = iVar4 + 1;
              pcVar13[lVar16] = ""[(uint)(int)(char)bVar2];
            }
          }
          (pcVar13 + (long)iVar4 + 4)[0] = 't';
          (pcVar13 + (long)iVar4 + 4)[1] = '\0';
          builtin_strncpy(pcVar13 + iVar4,"_ini",4);
          p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,pcVar13);
          pcVar9 = pcVar13;
        }
        if (p_Var11 == (_func_void *)0x0) {
          if (pzErrMsg != (char **)0x0) {
            sVar12 = strlen(pcVar9);
            iVar4 = sqlite3_initialize();
            if (iVar4 == 0) {
              n = sVar8 + sVar12 + 300;
              pcVar14 = (char *)sqlite3Malloc(n);
              *pzErrMsg = pcVar14;
              if (pcVar14 != (char *)0x0) {
                iVar4 = (int)n;
                sqlite3_snprintf(iVar4,pcVar14,"no entry point [%s] in shared library [%s]",pcVar9,
                                 zFile);
                (*psVar3->xDlError)(psVar3,iVar4 + -1,pcVar14);
              }
            }
            else {
              *pzErrMsg = (char *)0x0;
            }
          }
          (*psVar3->xDlClose)(psVar3,pvVar10);
          sqlite3_free(pcVar13);
LAB_00129024:
          iVar4 = 1;
        }
        else {
          sqlite3_free(pcVar13);
          iVar4 = (*p_Var11)(db,&local_40,&sqlite3Apis);
          if (iVar4 == 0) {
            __dest = (void **)sqlite3DbMallocZero(db,(long)db->nExtension * 8 + 8);
            if (__dest == (void **)0x0) goto LAB_00129323;
            if (0 < (long)db->nExtension) {
              memcpy(__dest,db->aExtension,(long)db->nExtension << 3);
            }
            if (db->aExtension != (void **)0x0) {
              sqlite3DbFreeNN(db,db->aExtension);
            }
            db->aExtension = __dest;
            iVar4 = db->nExtension;
            db->nExtension = iVar4 + 1;
            __dest[iVar4] = pvVar10;
          }
          else if (iVar4 != 0x100) {
            if (pzErrMsg != (char **)0x0) {
              pcVar9 = sqlite3_mprintf("error during initialization: %s",local_40);
              *pzErrMsg = pcVar9;
            }
            sqlite3_free(local_40);
            (*psVar3->xDlClose)(psVar3,pvVar10);
            goto LAB_00129024;
          }
          iVar4 = 0;
          iVar6 = 0;
          if (db->mallocFailed == '\0') goto LAB_00129337;
        }
        goto LAB_00129329;
      }
      pcVar13 = sqlite3_mprintf("%s.%s",zFile,"so");
      if (pcVar13 == (char *)0x0) {
LAB_00129323:
        iVar4 = 7;
        goto LAB_00129329;
      }
      if (sVar8 < 0xffe) {
        pvVar10 = (*psVar3->xDlOpen)(psVar3,pcVar13);
        sqlite3_free(pcVar13);
        if (pvVar10 != (void *)0x0) goto LAB_0012909b;
      }
      else {
        sqlite3_free(pcVar13);
      }
    }
    iVar4 = 1;
    if (pzErrMsg != (char **)0x0) {
      iVar6 = sqlite3_initialize();
      if (iVar6 == 0) {
        pcVar9 = (char *)sqlite3Malloc(sVar8 + 300);
        *pzErrMsg = pcVar9;
        if (pcVar9 != (char *)0x0) {
          sqlite3_snprintf((int)(sVar8 + 300),pcVar9,"unable to open shared library [%.*s]",0x1000,
                           zFile);
          (*psVar3->xDlError)(psVar3,(int)sVar8 + 299,pcVar9);
        }
      }
      else {
        *pzErrMsg = (char *)0x0;
      }
    }
  }
LAB_00129329:
  iVar6 = apiHandleError(db,iVar4);
LAB_00129337:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}